

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

void google::protobuf::internal::MapFieldPrinterHelper::CopyValue
               (MapValueRef *value,Message *message,FieldDescriptor *field_desc)

{
  bool value_00;
  CppType CVar1;
  int32 value_01;
  int iVar2;
  uint32 value_02;
  Message *pMVar3;
  undefined4 extraout_var;
  Message *pMVar4;
  uint64 value_03;
  int64 value_04;
  string *psVar5;
  Reflection *this;
  float value_05;
  double value_06;
  string sStack_48;
  
  (*(message->super_MessageLite)._vptr_MessageLite[0x15])(message);
  CVar1 = FieldDescriptor::cpp_type(field_desc);
  switch(CVar1) {
  case CPPTYPE_INT32:
    value_01 = MapValueRef::GetInt32Value(value);
    Reflection::SetInt32(this,message,field_desc,value_01);
    return;
  case CPPTYPE_INT64:
    value_04 = MapValueRef::GetInt64Value(value);
    Reflection::SetInt64(this,message,field_desc,value_04);
    return;
  case CPPTYPE_UINT32:
    value_02 = MapValueRef::GetUInt32Value(value);
    Reflection::SetUInt32(this,message,field_desc,value_02);
    return;
  case CPPTYPE_UINT64:
    value_03 = MapValueRef::GetUInt64Value(value);
    Reflection::SetUInt64(this,message,field_desc,value_03);
    return;
  case CPPTYPE_DOUBLE:
    value_06 = MapValueRef::GetDoubleValue(value);
    Reflection::SetDouble(this,message,field_desc,value_06);
    return;
  case CPPTYPE_FLOAT:
    value_05 = MapValueRef::GetFloatValue(value);
    Reflection::SetFloat(this,message,field_desc,value_05);
    return;
  case CPPTYPE_BOOL:
    value_00 = MapValueRef::GetBoolValue(value);
    Reflection::SetBool(this,message,field_desc,value_00);
    return;
  case CPPTYPE_ENUM:
    iVar2 = MapValueRef::GetEnumValue(value);
    Reflection::SetEnumValue(this,message,field_desc,iVar2);
    return;
  case CPPTYPE_STRING:
    psVar5 = MapValueRef::GetStringValue_abi_cxx11_(value);
    std::__cxx11::string::string((string *)&sStack_48,(string *)psVar5);
    Reflection::SetString(this,message,field_desc,&sStack_48);
    std::__cxx11::string::~string((string *)&sStack_48);
    break;
  case CPPTYPE_MESSAGE:
    pMVar3 = MapValueRef::GetMessageValue(value);
    iVar2 = (*(pMVar3->super_MessageLite)._vptr_MessageLite[3])(pMVar3);
    pMVar3 = (Message *)CONCAT44(extraout_var,iVar2);
    pMVar4 = MapValueRef::GetMessageValue(value);
    (*(pMVar3->super_MessageLite)._vptr_MessageLite[0x10])(pMVar3,pMVar4);
    Reflection::SetAllocatedMessage(this,message,pMVar3,field_desc);
    return;
  }
  return;
}

Assistant:

void MapFieldPrinterHelper::CopyValue(const MapValueRef& value,
                                      Message* message,
                                      const FieldDescriptor* field_desc) {
  const Reflection* reflection = message->GetReflection();
  switch (field_desc->cpp_type()) {
    case FieldDescriptor::CPPTYPE_DOUBLE:
      reflection->SetDouble(message, field_desc, value.GetDoubleValue());
      return;
    case FieldDescriptor::CPPTYPE_FLOAT:
      reflection->SetFloat(message, field_desc, value.GetFloatValue());
      return;
    case FieldDescriptor::CPPTYPE_ENUM:
      reflection->SetEnumValue(message, field_desc, value.GetEnumValue());
      return;
    case FieldDescriptor::CPPTYPE_MESSAGE: {
      Message* sub_message = value.GetMessageValue().New();
      sub_message->CopyFrom(value.GetMessageValue());
      reflection->SetAllocatedMessage(message, sub_message, field_desc);
      return;
    }
    case FieldDescriptor::CPPTYPE_STRING:
      reflection->SetString(message, field_desc, value.GetStringValue());
      return;
    case FieldDescriptor::CPPTYPE_INT64:
      reflection->SetInt64(message, field_desc, value.GetInt64Value());
      return;
    case FieldDescriptor::CPPTYPE_INT32:
      reflection->SetInt32(message, field_desc, value.GetInt32Value());
      return;
    case FieldDescriptor::CPPTYPE_UINT64:
      reflection->SetUInt64(message, field_desc, value.GetUInt64Value());
      return;
    case FieldDescriptor::CPPTYPE_UINT32:
      reflection->SetUInt32(message, field_desc, value.GetUInt32Value());
      return;
    case FieldDescriptor::CPPTYPE_BOOL:
      reflection->SetBool(message, field_desc, value.GetBoolValue());
      return;
  }
}